

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmres.h
# Opt level: O0

int GMRES<TPZMatrix<long_double>,TPZFMatrix<long_double>,TPZMatrixSolver<long_double>,TPZFMatrix<long_double>,double>
              (TPZMatrix<long_double> *A,TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *b,
              TPZMatrixSolver<long_double> *M,TPZFMatrix<long_double> *H,int *m,int64_t *max_iter,
              double *tol,TPZFMatrix<long_double> *residual,int FromCurrent)

{
  bool bVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  int64_t iVar6;
  longdouble *plVar7;
  longdouble *plVar8;
  longdouble *plVar9;
  longdouble *plVar10;
  ostream *poVar11;
  void *this;
  long *in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  long *in_RDI;
  ulong uVar12;
  int *in_R9;
  longdouble in_ST0;
  longdouble number;
  longdouble lVar13;
  longdouble lVar14;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar15;
  longdouble in_ST7;
  longdouble lVar16;
  REAL RVar17;
  double __x;
  long *in_stack_00000008;
  double *in_stack_00000010;
  TPZFMatrix<long_double> *in_stack_00000018;
  int in_stack_00000020;
  int64_t i_2;
  int64_t i_1;
  int64_t srows;
  int64_t i;
  int64_t rows;
  TPZFMatrix<long_double> *v;
  double beta;
  double normb;
  TPZFMatrix<long_double> *r;
  TPZFMatrix<long_double> *res;
  TPZFMatrix<long_double> resbackup;
  TPZFMatrix<long_double> w;
  TPZFMatrix<long_double> w1;
  TPZFMatrix<long_double> sn;
  TPZFMatrix<long_double> cs;
  TPZFMatrix<long_double> s;
  int64_t k;
  int64_t j;
  double resid;
  undefined2 in_stack_fffffffffffff9d0;
  undefined2 uVar18;
  undefined6 in_stack_fffffffffffff9d2;
  undefined2 in_stack_fffffffffffff9e0;
  undefined6 in_stack_fffffffffffff9e2;
  TPZFMatrix<long_double> *in_stack_fffffffffffff9e8;
  TPZFMatrix<long_double> *in_stack_fffffffffffff9f0;
  TPZFMatrix<long_double> *pTVar19;
  TPZFMatrix<long_double> *in_stack_fffffffffffffa00;
  TPZFMatrix<long_double> *in_stack_fffffffffffffa08;
  TPZFMatrix<long_double> *in_stack_fffffffffffffa10;
  TPZFMatrix<long_double> *this_00;
  TPZMatrix<long_double> *in_stack_fffffffffffffa18;
  TPZFMatrix<long_double> *in_stack_fffffffffffffa20;
  longdouble *in_stack_fffffffffffffa28;
  longdouble *in_stack_fffffffffffffa30;
  longdouble *in_stack_fffffffffffffa38;
  longdouble *in_stack_fffffffffffffa40;
  TPZFMatrix<long_double> *in_stack_fffffffffffffad0;
  TPZFMatrix<long_double> *in_stack_fffffffffffffad8;
  TPZFMatrix<long_double> *in_stack_fffffffffffffae0;
  longdouble *in_stack_fffffffffffffae8;
  TPZFMatrix<long_double> *in_stack_fffffffffffffaf0;
  TPZFMatrix<long_double> *local_488;
  long local_418;
  int64_t local_410;
  long local_400;
  double local_3e0;
  double local_3d8;
  TPZFMatrix<long_double> *local_3c8;
  TPZFMatrix<long_double> local_3c0;
  TPZFMatrix<long_double> local_330;
  undefined1 local_2a0 [144];
  TPZFMatrix<long_double> local_210;
  TPZFMatrix<long_double> local_170;
  TPZFMatrix<long_double> local_e0;
  long local_50;
  long local_48;
  double local_40;
  int *local_38;
  long *local_28;
  undefined8 local_20;
  long *local_18;
  long *local_10;
  int local_4;
  
  local_48 = 1;
  local_38 = in_R9;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  TPZFMatrix<long_double>::TPZFMatrix
            (in_stack_fffffffffffffa10,(int64_t)in_stack_fffffffffffffa08,
             (int64_t)in_stack_fffffffffffffa00);
  TPZFMatrix<long_double>::TPZFMatrix
            (in_stack_fffffffffffffa10,(int64_t)in_stack_fffffffffffffa08,
             (int64_t)in_stack_fffffffffffffa00);
  TPZFMatrix<long_double>::TPZFMatrix
            (in_stack_fffffffffffffa10,(int64_t)in_stack_fffffffffffffa08,
             (int64_t)in_stack_fffffffffffffa00);
  TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffffa00);
  TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffffa00);
  TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffffa00);
  local_3c8 = in_stack_00000018;
  if (in_stack_00000018 == (TPZFMatrix<long_double> *)0x0) {
    local_3c8 = &local_3c0;
  }
  (**(code **)(*local_28 + 0x58))(local_28,local_20,local_3c8,0);
  Norm((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffff9d2,in_stack_fffffffffffff9d0));
  uVar18 = (undefined2)((unkuint10)in_ST0 >> 0x40);
  lVar13 = in_ST7;
  local_3d8 = TPZExtractVal::val(in_ST0);
  if (in_stack_00000020 == 0) {
    (**(code **)(*local_18 + 0x78))();
    TPZFMatrix<long_double>::operator=
              (in_stack_fffffffffffff9e8,
               (TPZFMatrix<long_double> *)
               CONCAT62(in_stack_fffffffffffff9e2,in_stack_fffffffffffff9e0));
  }
  else {
    in_stack_fffffffffffff9e0 = (undefined2)((unkuint10)(longdouble)1 >> 0x40);
    uVar18 = (undefined2)((unkuint10)-(longdouble)1 >> 0x40);
    in_ST7 = in_ST6;
    lVar13 = in_ST6;
    (**(code **)(*local_10 + 0x138))(local_10,local_18,local_20,local_3c8,0);
  }
  (**(code **)(*local_28 + 0x58))(local_28,local_3c8,&local_330,0);
  TPZFMatrix<long_double>::operator=
            (in_stack_fffffffffffff9e8,
             (TPZFMatrix<long_double> *)
             CONCAT62(in_stack_fffffffffffff9e2,in_stack_fffffffffffff9e0));
  Norm((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffff9d2,uVar18));
  uVar18 = (undefined2)((unkuint10)in_ST1 >> 0x40);
  lVar15 = lVar13;
  local_3e0 = TPZExtractVal::val(in_ST1);
  if ((local_3d8 == 0.0) && (!NAN(local_3d8))) {
    local_3d8 = 1.0;
  }
  Norm((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffff9d2,uVar18));
  uVar18 = (undefined2)((unkuint10)in_ST2 >> 0x40);
  RVar17 = TPZExtractVal::val(in_ST2);
  local_40 = RVar17 / local_3d8;
  if (*in_stack_00000010 < local_40) {
    uVar3 = (ulong)(*local_38 + 1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar4 = SUB168(auVar2 * ZEXT816(0x90),0);
    uVar12 = uVar4 + 8;
    if (0xfffffffffffffff7 < uVar4) {
      uVar12 = 0xffffffffffffffff;
    }
    if (SUB168(auVar2 * ZEXT816(0x90),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar12);
    *puVar5 = uVar3;
    this_00 = (TPZFMatrix<long_double> *)(puVar5 + 1);
    if (uVar3 != 0) {
      local_488 = this_00;
      do {
        TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffffa00);
        local_488 = local_488 + 1;
      } while (local_488 != this_00 + uVar3);
    }
    do {
      if (*in_stack_00000008 < local_48) {
        *in_stack_00000010 = local_40;
        if (this_00 != (TPZFMatrix<long_double> *)0x0) {
          uVar3 = *puVar5;
          pTVar19 = this_00 + uVar3;
          if (this_00 != pTVar19) {
            do {
              pTVar19 = pTVar19 + -1;
              TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12d05e9);
            } while (pTVar19 != this_00);
          }
          operator_delete__(puVar5,uVar3 * 0x90 + 8);
        }
        local_4 = 1;
        goto LAB_012d062d;
      }
      iVar6 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_3c8);
      (*(this_00->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xd])(this_00,iVar6,1);
      number = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      in_ST6 = in_ST7;
      in_ST7 = lVar13;
      for (local_400 = 0; local_400 < iVar6; local_400 = local_400 + 1) {
        plVar7 = TPZFMatrix<long_double>::operator()(local_3c8,local_400);
        uVar18 = (undefined2)((unkuint10)*plVar7 >> 0x40);
        RVar17 = TPZExtractVal::val(*plVar7);
        plVar7 = TPZFMatrix<long_double>::operator()(this_00,local_400);
        *plVar7 = (longdouble)(RVar17 * (1.0 / local_3e0));
      }
      iVar6 = TPZBaseMatrix::Rows((TPZBaseMatrix *)&local_e0);
      for (local_410 = 0; local_410 < iVar6; local_410 = local_410 + 1) {
        plVar7 = TPZFMatrix<long_double>::operator()(&local_e0,local_410);
        *plVar7 = (longdouble)0;
      }
      plVar7 = TPZFMatrix<long_double>::operator()(&local_e0,0);
      *plVar7 = (longdouble)local_3e0;
      local_418 = 0;
      while( true ) {
        bVar1 = false;
        if (local_418 < *local_38) {
          bVar1 = local_48 <= *in_stack_00000008;
        }
        if (!bVar1) break;
        lVar16 = lVar15;
        (**(code **)(*local_10 + 0x128))(local_10,this_00 + local_418,local_2a0,0);
        (**(code **)(*local_28 + 0x58))(local_28,local_2a0,&local_330,0);
        lVar13 = number;
        lVar14 = in_ST3;
        number = in_ST4;
        in_ST3 = in_ST5;
        in_ST4 = in_ST6;
        in_ST5 = in_ST7;
        in_ST6 = lVar15;
        in_ST7 = lVar16;
        for (local_50 = 0; local_50 <= local_418; local_50 = local_50 + 1) {
          Dot<long_double>(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
          plVar7 = TPZFMatrix<long_double>::operator()
                             (in_stack_fffffffffffff9f0,(int64_t)in_stack_fffffffffffff9e8,
                              CONCAT62(in_stack_fffffffffffff9e2,in_stack_fffffffffffff9e0));
          *plVar7 = lVar13;
          plVar7 = TPZFMatrix<long_double>::operator()
                             (in_stack_fffffffffffff9f0,(int64_t)in_stack_fffffffffffff9e8,
                              CONCAT62(in_stack_fffffffffffff9e2,in_stack_fffffffffffff9e0));
          uVar18 = (undefined2)((unkuint10)-*plVar7 >> 0x40);
          lVar15 = in_ST7;
          TPZFMatrix<long_double>::ZAXPY(&local_330,-*plVar7,this_00 + local_50);
          lVar13 = lVar14;
          lVar14 = number;
          number = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          in_ST5 = in_ST6;
          in_ST6 = in_ST7;
          in_ST7 = lVar15;
        }
        Norm((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffff9d2,uVar18));
        plVar7 = TPZFMatrix<long_double>::operator()
                           (in_stack_fffffffffffff9f0,(int64_t)in_stack_fffffffffffff9e8,
                            CONCAT62(in_stack_fffffffffffff9e2,in_stack_fffffffffffff9e0));
        *plVar7 = lVar13;
        TPZFMatrix<long_double>::operator=
                  (in_stack_fffffffffffff9e8,
                   (TPZFMatrix<long_double> *)
                   CONCAT62(in_stack_fffffffffffff9e2,in_stack_fffffffffffff9e0));
        plVar7 = TPZFMatrix<long_double>::operator()
                           (in_stack_fffffffffffff9f0,(int64_t)in_stack_fffffffffffff9e8,
                            CONCAT62(in_stack_fffffffffffff9e2,in_stack_fffffffffffff9e0));
        TPZExtractVal::val(*plVar7);
        (*this_00[local_418 + 1].super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x26])(this_00 + local_418 + 1);
        for (local_50 = 0; local_50 < local_418; local_50 = local_50 + 1) {
          plVar7 = TPZFMatrix<long_double>::operator()
                             (in_stack_fffffffffffff9f0,(int64_t)in_stack_fffffffffffff9e8,
                              CONCAT62(in_stack_fffffffffffff9e2,in_stack_fffffffffffff9e0));
          in_stack_fffffffffffffaf0 =
               (TPZFMatrix<long_double> *)
               TPZFMatrix<long_double>::operator()
                         (in_stack_fffffffffffff9f0,(int64_t)in_stack_fffffffffffff9e8,
                          CONCAT62(in_stack_fffffffffffff9e2,in_stack_fffffffffffff9e0));
          in_stack_fffffffffffffae8 = TPZFMatrix<long_double>::operator()(&local_170,local_50);
          plVar8 = TPZFMatrix<long_double>::operator()(&local_210,local_50);
          ApplyPlaneRotation<long_double>
                    (plVar7,(longdouble *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,plVar8
                    );
        }
        in_stack_fffffffffffffae0 =
             (TPZFMatrix<long_double> *)
             TPZFMatrix<long_double>::operator()
                       (in_stack_fffffffffffff9f0,(int64_t)in_stack_fffffffffffff9e8,
                        CONCAT62(in_stack_fffffffffffff9e2,in_stack_fffffffffffff9e0));
        in_stack_fffffffffffffad8 =
             (TPZFMatrix<long_double> *)
             TPZFMatrix<long_double>::operator()
                       (in_stack_fffffffffffff9f0,(int64_t)in_stack_fffffffffffff9e8,
                        CONCAT62(in_stack_fffffffffffff9e2,in_stack_fffffffffffff9e0));
        in_stack_fffffffffffffad0 =
             (TPZFMatrix<long_double> *)TPZFMatrix<long_double>::operator()(&local_170,local_418);
        TPZFMatrix<long_double>::operator()(&local_210,local_418);
        GeneratePlaneRotation<long_double>
                  (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                   in_stack_fffffffffffffa28);
        plVar7 = TPZFMatrix<long_double>::operator()
                           (in_stack_fffffffffffff9f0,(int64_t)in_stack_fffffffffffff9e8,
                            CONCAT62(in_stack_fffffffffffff9e2,in_stack_fffffffffffff9e0));
        plVar8 = TPZFMatrix<long_double>::operator()
                           (in_stack_fffffffffffff9f0,(int64_t)in_stack_fffffffffffff9e8,
                            CONCAT62(in_stack_fffffffffffff9e2,in_stack_fffffffffffff9e0));
        plVar9 = TPZFMatrix<long_double>::operator()(&local_170,local_418);
        plVar10 = TPZFMatrix<long_double>::operator()(&local_210,local_418);
        ApplyPlaneRotation<long_double>(plVar7,plVar8,plVar9,plVar10);
        plVar7 = TPZFMatrix<long_double>::operator()(&local_e0,local_418);
        plVar8 = TPZFMatrix<long_double>::operator()(&local_e0,local_418 + 1);
        plVar9 = TPZFMatrix<long_double>::operator()(&local_170,local_418);
        plVar10 = TPZFMatrix<long_double>::operator()(&local_210,local_418);
        ApplyPlaneRotation<long_double>(plVar7,plVar8,plVar9,plVar10);
        plVar7 = TPZFMatrix<long_double>::operator()(&local_e0,local_418 + 1);
        uVar18 = (undefined2)((unkuint10)*plVar7 >> 0x40);
        lVar15 = in_ST7;
        std::fabs(__x);
        local_40 = (double)lVar14 / local_3d8;
        if (local_40 < *in_stack_00000010) {
          Update<TPZFMatrix<long_double>,TPZFMatrix<long_double>>
                    (in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8,
                     in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
          *in_stack_00000010 = local_40;
          *in_stack_00000008 = local_48;
          if (this_00 != (TPZFMatrix<long_double> *)0x0) {
            uVar3 = *puVar5;
            for (pTVar19 = this_00 + uVar3; this_00 != pTVar19; pTVar19 = pTVar19 + -1) {
              TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12d0298);
            }
            operator_delete__(puVar5,uVar3 * 0x90 + 8);
          }
          local_4 = 0;
          goto LAB_012d062d;
        }
        local_418 = local_418 + 1;
        local_48 = local_48 + 1;
      }
      Update<TPZFMatrix<long_double>,TPZFMatrix<long_double>>
                (in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8,
                 in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
      in_stack_fffffffffffff9e0 = (undefined2)((unkuint10)(longdouble)1 >> 0x40);
      uVar18 = (undefined2)((unkuint10)-(longdouble)1 >> 0x40);
      lVar13 = in_ST7;
      lVar15 = in_ST7;
      (**(code **)(*local_10 + 0x138))(local_10,local_18,local_20,local_3c8,0);
      (**(code **)(*local_28 + 0x58))(local_28,local_3c8,local_3c8,0);
      Norm((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffff9d2,uVar18));
      uVar18 = (undefined2)((unkuint10)number >> 0x40);
      local_3e0 = TPZExtractVal::val(number);
      local_40 = local_3e0 / local_3d8;
    } while (*in_stack_00000010 <= local_40);
    poVar11 = std::operator<<((ostream *)&std::cout,"iter ");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_48);
    poVar11 = std::operator<<(poVar11," - ");
    this = (void *)std::ostream::operator<<(poVar11,local_40);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    *in_stack_00000010 = local_40;
    *in_stack_00000008 = local_48;
    if (this_00 != (TPZFMatrix<long_double> *)0x0) {
      uVar3 = *puVar5;
      pTVar19 = this_00 + uVar3;
      if (this_00 != pTVar19) {
        do {
          pTVar19 = pTVar19 + -1;
          TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12d052c);
        } while (pTVar19 != this_00);
      }
      operator_delete__(puVar5,uVar3 * 0x90 + 8);
    }
    local_4 = 0;
  }
  else {
    *in_stack_00000010 = local_40;
    TPZFMatrix<long_double>::operator+=(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    *in_stack_00000008 = 0;
    local_4 = 0;
  }
LAB_012d062d:
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12d063a);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12d0647);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12d0654);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12d0661);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12d066e);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12d067b);
  return local_4;
}

Assistant:

int 
GMRES( Operator &A, Vector &x, const Vector &b,
	  Preconditioner &M, Matrix &H, int &m, int64_t &max_iter,
	  Real &tol, Vector *residual,const int FromCurrent)
{
	Real resid;
	int64_t j = 1, k;
	Vector s(m+1), cs(m+1), sn(m+1), w1,w;
	
	//  Real normb = norm(M.Solve(b));
	Vector resbackup;
	Vector *res = residual;
	if(!res) res = &resbackup;
	Vector &r = *res;
    M.Solve(b,r);
	Real normb = TPZExtractVal::val(Norm(r));	//  Vector r = b - A*x;
	if(FromCurrent) 
    {
        A.MultAdd(x,b,r,-1.,1.);
    } 
    else 
    {
		x.Zero();
		r = b;
	}
	M.Solve(r,w);
	r=w;
	Real beta = TPZExtractVal::val(Norm(r));
	
	if (normb == 0.0)
		normb = 1;
	
	if ((resid = ((Real)TPZExtractVal::val(Norm(r))) / normb) <= tol) {
		tol = resid;
		x+=r;
		max_iter = 0;
		return 0;
	}
	
	Vector *v = new Vector[m+1];
	
	while (j <= max_iter) {
        int64_t rows = r.Rows();
        v[0].Resize(rows,1);
        for (int64_t i=0; i<rows; i++) {
            v[0](i) = TPZExtractVal::val(r(i)) * ((Real)(1.0/beta));
        }
        int64_t srows = s.Rows();
        for (int64_t i=0; i<srows; i++) {
            s(i) = REAL(0.);
        }
//		v[0] = r * (REAL(1.0 / beta));    // ??? r / beta
//		s = REAL(0.0);
		s(0) = beta;
		
		for (int64_t i = 0; i < m && j <= max_iter; i++, j++) {
			A.Multiply(v[i],w1);
			M.Solve(w1,w);
			for (k = 0; k <= i; k++) {
				H(k, i) = Dot(w, v[k]);
				w.ZAXPY(-H(k, i), v[k]);
			}
			H(i+1, i) = Norm(w);
			v[i+1] = w;
			v[i+1] *= (1.0)/TPZExtractVal::val(H(i+1,i));
			
			for (k = 0; k < i; k++)
				ApplyPlaneRotation(H(k,i), H(k+1,i), cs(k), sn(k));
			
			GeneratePlaneRotation(H(i,i), H(i+1,i), cs(i), sn(i));
			ApplyPlaneRotation(H(i,i), H(i+1,i), cs(i), sn(i));
			ApplyPlaneRotation(s(i), s(i+1), cs(i), sn(i));
			resid = ((Real)fabs(s(i+1)))/normb;
			if (resid < tol) {
				Update(x, i, H, s, v);
				tol = resid;
				max_iter = j;
				delete [] v;
				return 0;
			}
		}
		Update(x, m - 1, H, s, v);
		A.MultAdd(x,b,r,-1.,1.);
		M.Solve(r,r);
		beta = TPZExtractVal::val(Norm(r));
        resid = beta/normb;
		if (resid < tol) {
            std::cout << "iter " << j << " - " << resid << std::endl;
			tol = resid;
			max_iter = j;
			delete [] v;
			return 0;
		}
	}
	
	tol = resid;
	delete [] v;
	return 1;
}